

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppmb_io.cpp
# Opt level: O0

bool ppmb_read_data(ifstream *input,int xsize,int ysize,uchar *r,uchar *g,uchar *b)

{
  byte bVar1;
  ostream *poVar2;
  int local_5c;
  int k;
  int j;
  uchar *indexr;
  uchar *indexg;
  uchar *indexb;
  int i;
  bool error;
  char c;
  uchar *b_local;
  uchar *g_local;
  uchar *r_local;
  int ysize_local;
  int xsize_local;
  ifstream *input_local;
  
  local_5c = 0;
  _k = r;
  indexr = g;
  indexg = b;
  _i = b;
  b_local = g;
  g_local = r;
  r_local._0_4_ = ysize;
  r_local._4_4_ = xsize;
  _ysize_local = input;
  do {
    if ((int)r_local <= local_5c) {
      return false;
    }
    for (indexb._0_4_ = 0; (int)indexb < r_local._4_4_; indexb._0_4_ = (int)indexb + 1) {
      std::istream::read((char *)_ysize_local,(long)&indexb + 7);
      if (_k != (uchar *)0x0) {
        *_k = indexb._7_1_;
        _k = _k + 1;
      }
      bVar1 = std::ios::eof();
      indexb._6_1_ = bVar1 & 1;
      if (indexb._6_1_ != 0) {
        std::operator<<((ostream *)&std::cout,"\n");
        std::operator<<((ostream *)&std::cout,"PPMB_READ_DATA - Fatal error!\n");
        poVar2 = std::operator<<((ostream *)&std::cout,"  End of file reading R byte of pixel (");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)indexb);
        poVar2 = std::operator<<(poVar2,", ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_5c);
        std::operator<<(poVar2,") \n");
        return true;
      }
      std::istream::read((char *)_ysize_local,(long)&indexb + 7);
      if (indexr != (uchar *)0x0) {
        *indexr = indexb._7_1_;
        indexr = indexr + 1;
      }
      bVar1 = std::ios::eof();
      indexb._6_1_ = bVar1 & 1;
      if (indexb._6_1_ != 0) {
        std::operator<<((ostream *)&std::cout,"\n");
        std::operator<<((ostream *)&std::cout,"PPMB_READ_DATA - Fatal error!\n");
        poVar2 = std::operator<<((ostream *)&std::cout,"  End of file reading G byte of pixel (");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)indexb);
        poVar2 = std::operator<<(poVar2,", ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_5c);
        std::operator<<(poVar2,") \n");
        return true;
      }
      std::istream::read((char *)_ysize_local,(long)&indexb + 7);
      if (indexg != (uchar *)0x0) {
        *indexg = indexb._7_1_;
        indexg = indexg + 1;
      }
      bVar1 = std::ios::eof();
      indexb._6_1_ = bVar1 & 1;
      if (indexb._6_1_ != 0) {
        std::operator<<((ostream *)&std::cout,"\n");
        std::operator<<((ostream *)&std::cout,"PPMB_READ_DATA - Fatal error!\n");
        poVar2 = std::operator<<((ostream *)&std::cout,"  End of file reading B byte of pixel (");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)indexb);
        poVar2 = std::operator<<(poVar2,", ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_5c);
        std::operator<<(poVar2,") \n");
        return true;
      }
      indexb._6_1_ = 0;
    }
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

bool ppmb_read_data ( ifstream &input, int xsize, int ysize, 
  unsigned char *r, unsigned char *g, unsigned char *b )

//****************************************************************************80
//
//  Purpose:
//
//    PPMB_READ_DATA reads the data in a binary portable pixel map file.
//
//  Discussion:
//
//    If the ordinary ">>" operator is used to input the data, then data that
//    happens to look like new lines or other white space is skipped.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    17 December 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, ifstream &input, a pointer to the file containing the binary
//    portable pixel map data.
//
//    Input, int XSIZE, YSIZE, the number of rows and columns of data.
//
//    Input, unsigned char *R, *G, *B, the arrays of XSIZE by YSIZE 
//    data values.
//
//    Output, bool PPMB_READ_DATA, is true if an error occurred.
//
{
  char c;
  bool error;
  int i;
  unsigned char *indexb;
  unsigned char *indexg;
  unsigned char *indexr;
  int j;
  int k;

  indexr = r;
  indexg = g;
  indexb = b;

  for ( j = 0; j < ysize; j++ )
  {
    for ( i = 0; i < xsize; i++ )
    {
      input.read ( &c, 1 );
	  if (indexr) {
        *indexr = ( unsigned char ) c;
         indexr = indexr + 1;
	  }
      error = input.eof();
      if ( error )
      {
        cout << "\n";
        cout << "PPMB_READ_DATA - Fatal error!\n";
        cout << "  End of file reading R byte of pixel (" 
          << i << ", " << j <<") \n";
        return true;
      }

      input.read ( &c, 1 );
	  if (indexg) {
        *indexg = ( unsigned char ) c;
         indexg = indexg + 1;
	  }
      error = input.eof();
      if ( error )
      {
        cout << "\n";
        cout << "PPMB_READ_DATA - Fatal error!\n";
        cout << "  End of file reading G byte of pixel (" 
          << i << ", " << j <<") \n";
        return true;
      }

      input.read ( &c, 1 );
	  if (indexb) {
        *indexb = ( unsigned char ) c;
        indexb = indexb + 1;
	  }
      error = input.eof();
      if ( error )
      {
        cout << "\n";
        cout << "PPMB_READ_DATA - Fatal error!\n";
        cout << "  End of file reading B byte of pixel (" 
          << i << ", " << j <<") \n";
        return true;
      }

    }
  }
  return false;
}